

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlFatalErr(xmlParserCtxtPtr ctxt,xmlParserErrors code,char *info)

{
  char *pcVar1;
  char *msg;
  
  pcVar1 = xmlErrString(code);
  if (info == (char *)0x0) {
    msg = "%s\n";
    info = (char *)0x0;
  }
  else {
    msg = "%s: %s\n";
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)info,(xmlChar *)0x0,
             (xmlChar *)0x0,0,msg,pcVar1);
  return;
}

Assistant:

void
xmlFatalErr(xmlParserCtxtPtr ctxt, xmlParserErrors code, const char *info)
{
    const char *errmsg;

    errmsg = xmlErrString(code);

    if (info == NULL) {
        xmlCtxtErr(ctxt, NULL, XML_FROM_PARSER, code, XML_ERR_FATAL,
                   NULL, NULL, NULL, 0, "%s\n", errmsg);
    } else {
        xmlCtxtErr(ctxt, NULL, XML_FROM_PARSER, code, XML_ERR_FATAL,
                   (const xmlChar *) info, NULL, NULL, 0,
                   "%s: %s\n", errmsg, info);
    }
}